

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode
UA_SecureChannel_sendBinaryMessage
          (UA_SecureChannel *channel,UA_UInt32 requestId,void *content,UA_DataType *contentType)

{
  UA_Connection *pUVar1;
  UA_StatusCode UVar2;
  uint uVar3;
  undefined1 auStack_88 [8];
  UA_NodeId typeId;
  UA_ChunkInfo ci;
  UA_ByteString message;
  size_t messagePos;
  
  pUVar1 = channel->connection;
  if (pUVar1 == (UA_Connection *)0x0) {
    UVar2 = 0x80020000;
  }
  else {
    UVar2 = (*pUVar1->getSendBuffer)
                      (pUVar1,(size_t)(pUVar1->localConf).sendBufferSize,(UA_ByteString *)&ci.final)
    ;
    if (UVar2 == 0) {
      message.length = message.length + 0x18;
      ci._32_8_ = ci._32_8_ + -0x18;
      message.data = (UA_Byte *)0x0;
      typeId.identifier.string.length = (size_t)(contentType->typeId).identifier.string.data;
      auStack_88._0_2_ = (contentType->typeId).namespaceIndex;
      auStack_88._2_2_ = *(undefined2 *)&(contentType->typeId).field_0x2;
      auStack_88._4_4_ = (contentType->typeId).identifierType;
      typeId._2_2_ = 0;
      typeId.namespaceIndex = contentType->binaryEncodingId;
      typeId.identifierType =
           (UA_NodeIdType)((contentType->typeId).identifier.string.length >> 0x20);
      UA_NodeId_encodeBinary
                ((UA_NodeId *)auStack_88,(UA_ByteString *)&ci.final,(size_t *)&message.data);
      ci.requestId._0_2_ = 0;
      ci.chunksSoFar = 0;
      ci._18_6_ = 0;
      ci.messageSizeSoFar._0_1_ = '\0';
      ci.channel._4_4_ = 0x47534d;
      ci.messageSizeSoFar._4_4_ = 0;
      uVar3 = typeId._0_4_ - 0x1be;
      if ((uVar3 < 10) && ((0x249U >> (uVar3 & 0x1f) & 1) != 0)) {
        ci.channel._4_4_ = *(undefined4 *)(&DAT_00129870 + (ulong)uVar3 * 4);
      }
      typeId.identifier.string.data = (UA_Byte *)channel;
      ci.channel._0_4_ = requestId;
      UVar2 = UA_encodeBinary(content,contentType,UA_SecureChannel_sendChunk,
                              (void *)((long)&typeId.identifier + 8),(UA_ByteString *)&ci.final,
                              (size_t *)&message.data);
      if (UVar2 == 0) {
        ci.messageSizeSoFar._0_1_ = 1;
        UVar2 = UA_SecureChannel_sendChunk
                          ((UA_ChunkInfo *)((long)&typeId.identifier + 8),(UA_ByteString *)&ci.final
                           ,(size_t)message.data);
      }
      else if ((char)ci.messageSizeSoFar == '\0') {
        ci.messageSizeSoFar._4_4_ = UVar2;
        UA_SecureChannel_sendChunk
                  ((UA_ChunkInfo *)((long)&typeId.identifier + 8),(UA_ByteString *)&ci.final,
                   (size_t)message.data);
      }
    }
  }
  return UVar2;
}

Assistant:

UA_StatusCode
UA_SecureChannel_sendBinaryMessage(UA_SecureChannel *channel, UA_UInt32 requestId,
                                   const void *content, const UA_DataType *contentType) {
    UA_Connection *connection = channel->connection;
    if(!connection)
        return UA_STATUSCODE_BADINTERNALERROR;

    /* Allocate the message buffer */
    UA_ByteString message;
    UA_StatusCode retval =
        connection->getSendBuffer(connection, connection->localConf.sendBufferSize, &message);
    if(retval != UA_STATUSCODE_GOOD)
        return retval;

    /* Hide the message beginning where the header will be encoded */
    message.data = &message.data[UA_SECURE_MESSAGE_HEADER_LENGTH];
    message.length -= UA_SECURE_MESSAGE_HEADER_LENGTH;

    /* Encode the message type */
    size_t messagePos = 0;
    UA_NodeId typeId = contentType->typeId; /* always numeric */
    typeId.identifier.numeric = contentType->binaryEncodingId;
    UA_NodeId_encodeBinary(&typeId, &message, &messagePos);

    /* Encode with the chunking callback */
    UA_ChunkInfo ci;
    ci.channel = channel;
    ci.requestId = requestId;
    ci.chunksSoFar = 0;
    ci.messageSizeSoFar = 0;
    ci.final = false;
    ci.messageType = UA_MESSAGETYPE_MSG;
    ci.errorCode = UA_STATUSCODE_GOOD;
    if(typeId.identifier.numeric == 446 || typeId.identifier.numeric == 449)
        ci.messageType = UA_MESSAGETYPE_OPN;
    else if(typeId.identifier.numeric == 452 || typeId.identifier.numeric == 455)
        ci.messageType = UA_MESSAGETYPE_CLO;
    retval = UA_encodeBinary(content, contentType,
                             (UA_exchangeEncodeBuffer)UA_SecureChannel_sendChunk,
                             &ci, &message, &messagePos);

    /* Encoding failed, release the message */
    if(retval != UA_STATUSCODE_GOOD) {
        if(!ci.final) {
            /* the abort message was not send */
            ci.errorCode = retval;
            UA_SecureChannel_sendChunk(&ci, &message, messagePos);
        }
        return retval;
    }

    /* Encoding finished, send the final chunk */
    ci.final = UA_TRUE;
    return UA_SecureChannel_sendChunk(&ci, &message, messagePos);
}